

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_threads_pthreads.c
# Opt level: O0

int zt_threads_pthreads_start
              (zt_threads_thread *_thread,zt_threads_attr *_attr,_func_void_ptr_void_ptr *start_cb,
              void *args)

{
  int iVar1;
  int iVar2;
  void *in_RCX;
  __start_routine *in_RDX;
  pthread_attr_t *in_RSI;
  pthread_t *in_RDI;
  int status;
  pthread_attr_t *attr;
  pthread_t *thread;
  
  iVar1 = pthread_create(in_RDI,in_RSI,in_RDX,in_RCX);
  iVar2 = 0;
  if (iVar1 != 0) {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int
zt_threads_pthreads_start(zt_threads_thread *_thread, zt_threads_attr *_attr,
                          void * (*start_cb)(void *), void *args) {
    pthread_t      *thread;
    pthread_attr_t *attr;
    int             status;

    thread = (pthread_t *)_thread;
    attr   = (pthread_attr_t *)_attr;

    status = pthread_create(thread, attr, start_cb, args);

    return status ? -1 : 0;
}